

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *pPVar1;
  long *plVar2;
  undefined8 uVar3;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  deUint64 *pdVar9;
  long *plVar10;
  int *piVar11;
  Parameters *pPVar12;
  Parameters *extraout_RDX;
  long lVar13;
  size_type __n;
  ulong uVar14;
  bool bVar15;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  objects;
  Environment env;
  Resources res_1;
  Resources res;
  undefined1 local_338 [16];
  pointer local_328;
  VkAllocationCallbacks *pVStack_320;
  Context *local_318;
  Move<vk::Handle<(vk::HandleType)23>_> local_310;
  Environment local_2f0;
  undefined1 local_2b8 [8];
  Deleter<vk::Handle<(vk::HandleType)23>_> aDStack_2b0 [4];
  ios_base local_240 [264];
  undefined1 local_138 [264];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_138,allocator,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar4 = Context::getDeviceInterface(context);
  pVVar5 = Context::getDevice(context);
  local_2f0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar12 = (Parameters *)context->m_progCollection;
  local_2f0.allocationCallbacks = (VkAllocationCallbacks *)(local_138 + 8);
  local_2f0.maxResourceConsumers = 1;
  local_2f0.vkp = pPVar1;
  local_2f0.vkd = pDVar4;
  local_2f0.device = pVVar5;
  local_2f0.programBinaries = (BinaryCollection *)pPVar12;
  Framebuffer::Resources::Resources
            ((Resources *)local_2b8,&local_2f0,(Parameters *)local_2f0.allocationCallbacks);
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_138);
  Framebuffer::create(&local_310,&local_2f0,(Resources *)local_2b8,pPVar12);
  local_328 = (pointer)local_310.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_device;
  pVStack_320 = local_310.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_338._0_8_ =
       local_310.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_338._8_8_ =
       local_310.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_138);
  if (local_338._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_338 + 8),
               (VkFramebuffer)local_338._0_8_);
  }
  Framebuffer::Resources::~Resources((Resources *)local_2b8);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_138);
  sVar6 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar7 - sVar6,0);
  __n = 0x4000;
  if (sVar6 < 0x4000) {
    __n = sVar6;
  }
  local_2f0.vkp = context->m_platformInterface;
  local_2f0.vkd = Context::getDeviceInterface(context);
  local_2f0.device = Context::getDevice(context);
  local_2f0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_2f0.programBinaries = context->m_progCollection;
  local_2f0.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_2f0.maxResourceConsumers = (deUint32)__n;
  Framebuffer::Resources::Resources((Resources *)local_138,&local_2f0,extraout_RDX);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
            *)local_338,__n,(allocator_type *)local_2b8);
  local_2b8 = (undefined1  [8])context->m_testCtx->m_log;
  local_318 = context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_2b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_2b0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)aDStack_2b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_2b0," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)23>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)((long)aDStack_2b0[0].m_deviceIface - 0x18) +
                    (int)aDStack_2b0);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_2b0,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_2b0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_2b0);
  std::ios_base::~ios_base(local_240);
  if (sVar6 != 0) {
    lVar13 = 8;
    uVar14 = 0;
    do {
      pdVar9 = (deUint64 *)operator_new(0x20);
      Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)local_2b8,&local_2f0,
                          (Resources *)local_138,pPVar12);
      pdVar9[2] = (deUint64)aDStack_2b0[0].m_device;
      pdVar9[3] = (deUint64)aDStack_2b0[0].m_allocator;
      *pdVar9 = (deUint64)local_2b8;
      pdVar9[1] = (deUint64)aDStack_2b0[0].m_deviceIface;
      local_2b8 = (undefined1  [8])0x0;
      aDStack_2b0[0].m_deviceIface = (DeviceInterface *)0x0;
      aDStack_2b0[0].m_device = (VkDevice)0x0;
      aDStack_2b0[0].m_allocator = (VkAllocationCallbacks *)0x0;
      plVar10 = (long *)operator_new(0x20);
      uVar3 = local_338._0_8_;
      *(undefined4 *)(plVar10 + 1) = 0;
      *(undefined4 *)((long)plVar10 + 0xc) = 0;
      *plVar10 = (long)&PTR__SharedPtrState_00d24bd0;
      plVar10[2] = (long)pdVar9;
      *(undefined4 *)(plVar10 + 1) = 1;
      *(undefined4 *)((long)plVar10 + 0xc) = 1;
      plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)local_338._0_8_ + lVar13
                         );
      if (plVar2 != plVar10) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)(local_338._0_8_ + lVar13 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)
                                           local_338._0_8_ + lVar13) + 0x10))();
          }
          LOCK();
          piVar11 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar3 +
                                     lVar13) + 0xc);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar3 + lVar13);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar3 + lVar13) = 0;
          }
        }
        *(deUint64 **)(uVar3 + lVar13 + -8) = pdVar9;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar3 + lVar13) = plVar10;
        LOCK();
        *(int *)(plVar10 + 1) = (int)plVar10[1] + 1;
        UNLOCK();
        LOCK();
        piVar11 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar3 + lVar13
                                   ) + 0xc);
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      plVar2 = plVar10 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar10 + 0x10))(plVar10);
      }
      piVar11 = (int *)((long)plVar10 + 0xc);
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        (**(code **)(*plVar10 + 8))(plVar10);
      }
      if (local_2b8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  (aDStack_2b0,(VkFramebuffer)local_2b8);
      }
      bVar15 = (uVar14 & 0x3ff) != 0;
      pPVar12 = (Parameters *)CONCAT71((int7)((ulong)pPVar12 >> 8),bVar15 || uVar14 == 0);
      if (!bVar15 && uVar14 != 0) {
        tcu::TestContext::touchWatchdog(local_318->m_testCtx);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (__n != uVar14);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
                     *)local_338,(pointer)local_338._0_8_);
  local_2b8 = (undefined1  [8])&aDStack_2b0[0].m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_2b8,
             (undefined1 *)((long)aDStack_2b0[0].m_deviceIface + (long)local_2b8));
  if (local_2b8 != (undefined1  [8])&aDStack_2b0[0].m_device) {
    operator_delete((void *)local_2b8,(ulong)(aDStack_2b0[0].m_device + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
             *)local_338);
  Framebuffer::Resources::~Resources((Resources *)local_138);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}